

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestLazyMessageRepeated::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  TestLazyMessageRepeated **v1;
  TestLazyMessageRepeated **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<edition_unittest::TestLazyMessage> *this;
  RepeatedPtrField<edition_unittest::TestLazyMessage> *other;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TestLazyMessageRepeated *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestLazyMessageRepeated *from;
  TestLazyMessageRepeated *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TestLazyMessageRepeated *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestLazyMessageRepeated *)to_msg;
  _this = (TestLazyMessageRepeated *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestLazyMessageRepeated_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestLazyMessageRepeated*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::TestLazyMessageRepeated_const*,edition_unittest::TestLazyMessageRepeated*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
               ,0x6334,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_repeated_message(from);
  other = _internal_repeated_message((TestLazyMessageRepeated *)absl_log_internal_check_op_result);
  google::protobuf::RepeatedPtrField<edition_unittest::TestLazyMessage>::MergeFrom(this,other);
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void TestLazyMessageRepeated::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestLazyMessageRepeated*>(&to_msg);
  auto& from = static_cast<const TestLazyMessageRepeated&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestLazyMessageRepeated)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_message()->MergeFrom(
      from._internal_repeated_message());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}